

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parquet_types.cpp
# Opt level: O0

ssize_t __thiscall
duckdb_parquet::PageEncodingStats::read
          (PageEncodingStats *this,int __fd,void *__buf,size_t __nbytes)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  uint32_t uVar4;
  uint uVar5;
  undefined8 uVar6;
  TProtocolException *this_00;
  undefined4 in_register_00000034;
  int32_t ecast94;
  int32_t ecast93;
  bool isset_count;
  bool isset_encoding;
  bool isset_page_type;
  int16_t fid;
  TType ftype;
  string fname;
  uint32_t xfer;
  TInputRecursionTracker tracker;
  undefined4 in_stack_ffffffffffffff38;
  TProtocolExceptionType in_stack_ffffffffffffff3c;
  TProtocolException *in_stack_ffffffffffffff40;
  string *in_stack_ffffffffffffff48;
  TProtocol *in_stack_ffffffffffffff50;
  type local_60;
  type local_5c;
  short local_46;
  int local_44;
  string local_40 [36];
  uint local_1c;
  undefined8 local_10;
  PageEncodingStats *local_8;
  
  local_10 = CONCAT44(in_register_00000034,__fd);
  local_8 = this;
  duckdb_apache::thrift::protocol::TInputRecursionTracker::TInputRecursionTracker
            ((TInputRecursionTracker *)in_stack_ffffffffffffff40,
             (TProtocol *)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38));
  local_1c = 0;
  std::__cxx11::string::string(local_40);
  uVar4 = duckdb_apache::thrift::protocol::TProtocol::readStructBegin
                    ((TProtocol *)in_stack_ffffffffffffff40,
                     (string *)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38));
  local_1c = uVar4 + local_1c;
  bVar1 = false;
  bVar2 = false;
  bVar3 = false;
  while( true ) {
    uVar4 = duckdb_apache::thrift::protocol::TProtocol::readFieldBegin
                      (in_stack_ffffffffffffff50,in_stack_ffffffffffffff48,
                       (TType *)in_stack_ffffffffffffff40,
                       (int16_t *)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38));
    local_1c = uVar4 + local_1c;
    if (local_44 == 0) break;
    if (local_46 == 1) {
      if (local_44 == 8) {
        uVar4 = duckdb_apache::thrift::protocol::TProtocol::readI32
                          ((TProtocol *)in_stack_ffffffffffffff40,
                           (int32_t *)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38))
        ;
        local_1c = uVar4 + local_1c;
        this->page_type = local_5c;
        bVar1 = true;
      }
      else {
        uVar4 = duckdb_apache::thrift::protocol::TProtocol::skip
                          ((TProtocol *)in_stack_ffffffffffffff40,in_stack_ffffffffffffff3c);
        local_1c = uVar4 + local_1c;
      }
    }
    else if (local_46 == 2) {
      if (local_44 == 8) {
        uVar4 = duckdb_apache::thrift::protocol::TProtocol::readI32
                          ((TProtocol *)in_stack_ffffffffffffff40,
                           (int32_t *)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38))
        ;
        local_1c = uVar4 + local_1c;
        this->encoding = local_60;
        bVar2 = true;
      }
      else {
        uVar4 = duckdb_apache::thrift::protocol::TProtocol::skip
                          ((TProtocol *)in_stack_ffffffffffffff40,in_stack_ffffffffffffff3c);
        local_1c = uVar4 + local_1c;
      }
    }
    else if (local_46 == 3) {
      if (local_44 == 8) {
        uVar4 = duckdb_apache::thrift::protocol::TProtocol::readI32
                          ((TProtocol *)in_stack_ffffffffffffff40,
                           (int32_t *)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38))
        ;
        local_1c = uVar4 + local_1c;
        bVar3 = true;
      }
      else {
        uVar4 = duckdb_apache::thrift::protocol::TProtocol::skip
                          ((TProtocol *)in_stack_ffffffffffffff40,in_stack_ffffffffffffff3c);
        local_1c = uVar4 + local_1c;
      }
    }
    else {
      uVar4 = duckdb_apache::thrift::protocol::TProtocol::skip
                        ((TProtocol *)in_stack_ffffffffffffff40,in_stack_ffffffffffffff3c);
      local_1c = uVar4 + local_1c;
    }
    uVar4 = duckdb_apache::thrift::protocol::TProtocol::readFieldEnd((TProtocol *)0x70c31a);
    local_1c = uVar4 + local_1c;
  }
  uVar4 = duckdb_apache::thrift::protocol::TProtocol::readStructEnd((TProtocol *)0x70c344);
  uVar5 = uVar4 + local_1c;
  local_1c = uVar5;
  if (!bVar1) {
    uVar6 = __cxa_allocate_exception(0x30);
    duckdb_apache::thrift::protocol::TProtocolException::TProtocolException
              (in_stack_ffffffffffffff40,in_stack_ffffffffffffff3c);
    __cxa_throw(uVar6,&duckdb_apache::thrift::protocol::TProtocolException::typeinfo,
                duckdb_apache::thrift::protocol::TProtocolException::~TProtocolException);
  }
  if (!bVar2) {
    uVar6 = __cxa_allocate_exception(0x30);
    duckdb_apache::thrift::protocol::TProtocolException::TProtocolException
              (in_stack_ffffffffffffff40,in_stack_ffffffffffffff3c);
    __cxa_throw(uVar6,&duckdb_apache::thrift::protocol::TProtocolException::typeinfo,
                duckdb_apache::thrift::protocol::TProtocolException::~TProtocolException);
  }
  if (bVar3) {
    std::__cxx11::string::~string(local_40);
    duckdb_apache::thrift::protocol::TInputRecursionTracker::~TInputRecursionTracker
              ((TInputRecursionTracker *)0x70c4a1);
    return (ulong)uVar5;
  }
  this_00 = (TProtocolException *)__cxa_allocate_exception(0x30);
  duckdb_apache::thrift::protocol::TProtocolException::TProtocolException
            (this_00,in_stack_ffffffffffffff3c);
  __cxa_throw(this_00,&duckdb_apache::thrift::protocol::TProtocolException::typeinfo,
              duckdb_apache::thrift::protocol::TProtocolException::~TProtocolException);
}

Assistant:

uint32_t PageEncodingStats::read(::apache::thrift::protocol::TProtocol* iprot) {

  ::apache::thrift::protocol::TInputRecursionTracker tracker(*iprot);
  uint32_t xfer = 0;
  std::string fname;
  ::apache::thrift::protocol::TType ftype;
  int16_t fid;

  xfer += iprot->readStructBegin(fname);

  using ::apache::thrift::protocol::TProtocolException;

  bool isset_page_type = false;
  bool isset_encoding = false;
  bool isset_count = false;

  while (true)
  {
    xfer += iprot->readFieldBegin(fname, ftype, fid);
    if (ftype == ::apache::thrift::protocol::T_STOP) {
      break;
    }
    switch (fid)
    {
      case 1:
        if (ftype == ::apache::thrift::protocol::T_I32) {
          int32_t ecast93;
          xfer += iprot->readI32(ecast93);
          this->page_type = static_cast<PageType::type>(ecast93);
          isset_page_type = true;
        } else {
          xfer += iprot->skip(ftype);
        }
        break;
      case 2:
        if (ftype == ::apache::thrift::protocol::T_I32) {
          int32_t ecast94;
          xfer += iprot->readI32(ecast94);
          this->encoding = static_cast<Encoding::type>(ecast94);
          isset_encoding = true;
        } else {
          xfer += iprot->skip(ftype);
        }
        break;
      case 3:
        if (ftype == ::apache::thrift::protocol::T_I32) {
          xfer += iprot->readI32(this->count);
          isset_count = true;
        } else {
          xfer += iprot->skip(ftype);
        }
        break;
      default:
        xfer += iprot->skip(ftype);
        break;
    }
    xfer += iprot->readFieldEnd();
  }

  xfer += iprot->readStructEnd();

  if (!isset_page_type)
    throw TProtocolException(TProtocolException::INVALID_DATA);
  if (!isset_encoding)
    throw TProtocolException(TProtocolException::INVALID_DATA);
  if (!isset_count)
    throw TProtocolException(TProtocolException::INVALID_DATA);
  return xfer;
}